

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void ot::commissioner::Console::Write(string *aLine,Color aColor)

{
  int iVar1;
  ostream *poVar2;
  string colorCode;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  if (Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::kResetCode_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)
                                 ::kResetCode_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                  kResetCode_abi_cxx11_,"\x1b[0m",(allocator *)&local_30);
      __cxa_atexit(std::__cxx11::string::~string,
                   &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                    kResetCode_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                           kResetCode_abi_cxx11_);
    }
  }
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  if (aColor < 8) {
    std::__cxx11::string::assign((char *)&local_30);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_30);
  poVar2 = std::operator<<(poVar2,(string *)aLine);
  poVar2 = std::operator<<(poVar2,(string *)
                                  &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)
                                   ::kResetCode_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Console::Write(const std::string &aLine, Color aColor)
{
    static const std::string kResetCode = "\u001b[0m";
    std::string              colorCode;

    switch (aColor)
    {
    case Color::kDefault:
        colorCode = "\u001b[0m";
        break;
    case Color::kWhite:
        colorCode = "\u001b[37m";
        break;
    case Color::kRed:
        colorCode = "\u001b[31m";
        break;
    case Color::kGreen:
        colorCode = "\u001b[32m";
        break;
    case Color::kYellow:
        colorCode = "\u001b[33m";
        break;
    case Color::kBlue:
        colorCode = "\u001b[34m";
        break;
    case Color::kMagenta:
        colorCode = "\u001b[35m";
        break;
    case Color::kCyan:
        colorCode = "\u001b[36m";
        break;
    }

    std::cout << colorCode << aLine << kResetCode << std::endl;
}